

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildRender32bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uint in_marker_pixel_value)

{
  int iVar1;
  ulong uVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  
  if (-1 < x) {
    iVar1 = atlas->TexWidth;
    if (w + x <= iVar1) {
      if ((-1 < y) && (h + y <= atlas->TexHeight)) {
        if (0 < h) {
          puVar3 = atlas->TexPixelsRGBA32 + (ulong)(uint)x + (long)(y * iVar1);
          iVar5 = 0;
          do {
            if (0 < w) {
              uVar2 = 0;
              do {
                uVar4 = 0;
                if (in_str[uVar2] == in_marker_char) {
                  uVar4 = in_marker_pixel_value;
                }
                puVar3[uVar2] = uVar4;
                uVar2 = uVar2 + 1;
              } while ((uint)w != uVar2);
              iVar1 = atlas->TexWidth;
            }
            iVar5 = iVar5 + 1;
            puVar3 = puVar3 + iVar1;
            in_str = in_str + w;
          } while (iVar5 != h);
        }
        return;
      }
      __assert_fail("y >= 0 && y + h <= atlas->TexHeight",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa53,
                    "void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas *, int, int, int, int, const char *, char, unsigned int)"
                   );
    }
  }
  __assert_fail("x >= 0 && x + w <= atlas->TexWidth",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                ,0xa52,
                "void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas *, int, int, int, int, const char *, char, unsigned int)"
               );
}

Assistant:

void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned int in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned int* out_pixel = atlas->TexPixelsRGBA32 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : IM_COL32_BLACK_TRANS;
}